

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__hdr_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  long lVar2;
  int local_448;
  int local_444;
  int dummy;
  int valid;
  char *token;
  char buffer [1024];
  int *local_30;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  local_444 = 0;
  y_local = x;
  if (x == (int *)0x0) {
    y_local = &local_448;
  }
  comp_local = y;
  if (y == (int *)0x0) {
    comp_local = &local_448;
  }
  local_30 = comp;
  if (comp == (int *)0x0) {
    local_30 = &local_448;
  }
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  else {
    while (_dummy = stbi__hdr_gettoken(s,(char *)&token), *_dummy != '\0') {
      iVar1 = strcmp(_dummy,"FORMAT=32-bit_rle_rgbe");
      if (iVar1 == 0) {
        local_444 = 1;
      }
    }
    if (local_444 == 0) {
      stbi__rewind(s);
      s_local._4_4_ = 0;
    }
    else {
      _dummy = stbi__hdr_gettoken(s,(char *)&token);
      iVar1 = strncmp(_dummy,"-Y ",3);
      if (iVar1 == 0) {
        _dummy = _dummy + 3;
        lVar2 = strtol(_dummy,(char **)&dummy,10);
        *comp_local = (int)lVar2;
        for (; *_dummy == ' '; _dummy = _dummy + 1) {
        }
        iVar1 = strncmp(_dummy,"+X ",3);
        if (iVar1 == 0) {
          _dummy = _dummy + 3;
          lVar2 = strtol(_dummy,(char **)0x0,10);
          *y_local = (int)lVar2;
          *local_30 = 3;
          s_local._4_4_ = 1;
        }
        else {
          stbi__rewind(s);
          s_local._4_4_ = 0;
        }
      }
      else {
        stbi__rewind(s);
        s_local._4_4_ = 0;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__hdr_info(stbi__context *s, int *x, int *y, int *comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int dummy;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (stbi__hdr_test(s) == 0) {
       stbi__rewind( s );
       return 0;
   }

   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid) {
       stbi__rewind( s );
       return 0;
   }
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *y = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *x = (int) strtol(token, NULL, 10);
   *comp = 3;
   return 1;
}